

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError AlsaRestart(PaAlsaStream *stream)

{
  PaError local_14;
  PaError result;
  PaAlsaStream *stream_local;
  
  local_14 = 0;
  paUtilErr_ = PaUnixMutex_Lock(&stream->stateMtx);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaUnixMutex_Lock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3239\n"
                     );
    local_14 = paUtilErr_;
  }
  else {
    paUtilErr_ = AlsaStop(stream,0);
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'AlsaStop( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3240\n"
                       );
      local_14 = paUtilErr_;
    }
    else {
      paUtilErr_ = AlsaStart(stream,0);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3241\n"
                         );
        local_14 = paUtilErr_;
      }
    }
  }
  while( true ) {
    paUtilErr_ = PaUnixMutex_Unlock(&stream->stateMtx);
    if (-1 < paUtilErr_) break;
    PaUtil_DebugPrint(
                     "Expression \'PaUnixMutex_Unlock( &stream->stateMtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 3246\n"
                     );
    local_14 = paUtilErr_;
  }
  return local_14;
}

Assistant:

static PaError AlsaRestart( PaAlsaStream *stream )
{
    PaError result = paNoError;

    PA_ENSURE( PaUnixMutex_Lock( &stream->stateMtx ) );
    PA_ENSURE( AlsaStop( stream, 0 ) );
    PA_ENSURE( AlsaStart( stream, 0 ) );

    PA_DEBUG(( "%s: Restarted audio\n", __FUNCTION__ ));

error:
    PA_ENSURE( PaUnixMutex_Unlock( &stream->stateMtx ) );

    return result;
}